

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O1

void __thiscall jbcoin::STTx::STTx(STTx *this,STObject *object)

{
  atomic<int> *paVar1;
  SField *pSVar2;
  bool bVar3;
  unsigned_short uVar4;
  Counter *pCVar5;
  Counter *pCVar6;
  Item *type;
  uint256 local_30;
  
  pSVar2 = (object->super_STBase).fName;
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STBase_002d6fc0;
  (this->super_STObject).super_STBase.fName = pSVar2;
  pCVar5 = CountedObject<jbcoin::STObject>::getCounter();
  LOCK();
  paVar1 = &(pCVar5->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STObject_002d7120;
  (this->super_STObject).v_.
  super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
  super__Vector_impl_data._M_start =
       (object->v_).
       super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->super_STObject).v_.
  super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (object->v_).
       super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->super_STObject).v_.
  super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (object->v_).
       super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (object->v_).super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (object->v_).super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (object->v_).super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_STObject).mType = object->mType;
  pCVar6 = CountedObject<jbcoin::STTx>::getCounter();
  LOCK();
  paVar1 = &(pCVar6->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STTx_002d7240;
  (this->tid_).pn[0] = 0;
  (this->tid_).pn[1] = 0;
  (this->tid_).pn[2] = 0;
  (this->tid_).pn[3] = 0;
  (this->tid_).pn[4] = 0;
  (this->tid_).pn[5] = 0;
  (this->tid_).pn[6] = 0;
  (this->tid_).pn[7] = 0;
  uVar4 = STObject::getFieldByValue<jbcoin::STInteger<unsigned_short>,unsigned_short>
                    (&this->super_STObject,(SField *)&sfTransactionType);
  this->tx_type_ = (uint)uVar4;
  type = getTxFormat((uint)uVar4);
  bVar3 = STObject::setType(&this->super_STObject,&type->elements);
  if (bVar3) {
    STObject::getHash(&local_30,&this->super_STObject,HashPrefix::transactionID);
    *(undefined8 *)((this->tid_).pn + 4) = local_30.pn._16_8_;
    *(undefined8 *)((this->tid_).pn + 6) = local_30.pn._24_8_;
    *(undefined8 *)(this->tid_).pn = local_30.pn._0_8_;
    *(undefined8 *)((this->tid_).pn + 2) = local_30.pn._8_8_;
    return;
  }
  Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"transaction not valid");
}

Assistant:

STTx::STTx (STObject&& object)
    : STObject (std::move (object))
{
    tx_type_ = static_cast <TxType> (getFieldU16 (sfTransactionType));

    if (!setType (getTxFormat (tx_type_)->elements))
        Throw<std::runtime_error> ("transaction not valid");

    tid_ = getHash(HashPrefix::transactionID);
}